

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

void __thiscall Js::JavascriptArray::SetLength(JavascriptArray *this,uint32 newLength)

{
  uint uVar1;
  DynamicObjectFlags DVar2;
  SparseArraySegmentBase *pSVar3;
  SparseArraySegmentBase *this_00;
  Type *pTVar4;
  
  uVar1 = (this->super_ArrayObject).length;
  if (uVar1 == newLength) {
    return;
  }
  pSVar3 = (this->head).ptr;
  if (pSVar3 != EmptySegment) {
    if (newLength == 0) {
      (*(this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
        .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])(this,pSVar3,0);
      pSVar3 = (this->head).ptr;
      pSVar3->length = 0;
      (pSVar3->next).ptr = (SparseArraySegmentBase *)0x0;
      DVar2 = DynamicObject::GetArrayFlags((DynamicObject *)this);
      DynamicObject::SetArrayFlags((DynamicObject *)this,DVar2 | HasNoMissingValues);
      ClearSegmentMap(this);
    }
    else {
      if (uVar1 <= newLength) goto LAB_00b6d545;
      pSVar3 = GetBeginLookupSegment(this,newLength - 1,true);
      if (pSVar3 != (SparseArraySegmentBase *)0x0) {
        uVar1 = pSVar3->left;
        if (uVar1 < newLength) {
          do {
            this_00 = pSVar3;
            if (newLength <= this_00->length + uVar1) {
              if ((this_00->next).ptr != (SparseArraySegmentBase *)0x0) {
                ClearSegmentMap(this);
                uVar1 = this_00->left;
              }
              (*(this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x73])(this,this_00,(ulong)(newLength - uVar1));
              (this_00->next).ptr = (SparseArraySegmentBase *)0x0;
              this_00->length = newLength - uVar1;
              SparseArraySegmentBase::CheckLengthvsSize(this_00);
              goto LAB_00b6d539;
            }
            pSVar3 = (this_00->next).ptr;
            if (pSVar3 == (SparseArraySegmentBase *)0x0) goto LAB_00b6d539;
            uVar1 = pSVar3->left;
          } while (uVar1 < newLength);
          pTVar4 = &this_00->next;
        }
        else {
          pTVar4 = &this->head;
        }
        ClearSegmentMap(this);
        pTVar4->ptr = (SparseArraySegmentBase *)0x0;
      }
    }
LAB_00b6d539:
    SetLastUsedSegment(this,(this->head).ptr);
  }
LAB_00b6d545:
  (this->super_ArrayObject).length = newLength;
  (*(this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])(this);
  return;
}

Assistant:

void JavascriptArray::SetLength(uint32 newLength)
    {
        if (newLength == length)
            return;

        if (head == EmptySegment)
        {
            // Do nothing to the segment.
        }
        else if (newLength == 0)
        {
            this->ClearElements(head, 0);
            head->length = 0;
            head->next = nullptr;
            SetHasNoMissingValues();

            ClearSegmentMap();
            this->InvalidateLastUsedSegment();
        }
        else if (newLength < length)
        {
            // _ _ 2 3 _ _ 6 7 _ _

            // SetLength(0)
            // 0 <= left -> set *prev = null
            // SetLength(2)
            // 2 <= left -> set *prev = null
            // SetLength(3)
            // 3 !<= left; 3 <= right -> truncate to length - 1
            // SetLength(5)
            // 5 <=

            SparseArraySegmentBase* next = GetBeginLookupSegment(newLength - 1); // head, or next.left < newLength
            Field(SparseArraySegmentBase*)* prev = &head;

            while(next != nullptr)
            {
                if (newLength <= next->left)
                {
                    ClearSegmentMap(); // truncate segments, null out segmentMap
                    *prev = nullptr;
                    break;
                }
                else if (newLength <= (next->left + next->length))
                {
                    if (next->next)
                    {
                        ClearSegmentMap(); // Will truncate segments, null out segmentMap
                    }

                    uint32 newSegmentLength = newLength - next->left;
                    this->ClearElements(next, newSegmentLength);
                    next->next = nullptr;
                    next->length = newSegmentLength;
                    next->CheckLengthvsSize();
                    break;
                }
                else
                {
                    prev = &next->next;
                    next = next->next;
                }
            }
            this->InvalidateLastUsedSegment();
        }
        this->length = newLength;

#ifdef VALIDATE_ARRAY
        ValidateArray();
#endif
    }